

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O0

ZZ<130UL> * __thiscall GF2::ZZ<130UL>::Div(ZZ<130UL> *this,word *wRight)

{
  word wVar1;
  word wVar2;
  undefined8 *in_RSI;
  ZZ<130UL> *in_RDI;
  size_t pos;
  dword divisor;
  word rem;
  long local_30;
  undefined8 local_18;
  
  local_18 = 0;
  for (local_30 = 2; local_30 != -1; local_30 = local_30 + -1) {
    wVar1 = (in_RDI->super_WW<130UL>)._words[local_30];
    wVar2 = __udivti3(wVar1,local_18,*in_RSI);
    (in_RDI->super_WW<130UL>)._words[local_30] = wVar2;
    local_18 = __umodti3(wVar1,local_18,*in_RSI,0);
  }
  *in_RSI = local_18;
  return in_RDI;
}

Assistant:

ZZ& Div(word& wRight)
	{	
		assert(wRight != 0);
		word rem = 0;
		if (_wcount == 1)
		{
			rem = _words[0] % wRight;
			_words[0] /= wRight;
			wRight = rem;
			return *this;
		}
		dword divisor;
		for (size_t pos = _wcount - 1; pos != SIZE_MAX; --pos)
		{
			// делим (предыдущий_остаток, текущий_разряд) на wRight
			divisor = rem;
			divisor <<= B_PER_W;
			divisor |= _words[pos];
			_words[pos] = word(divisor / wRight);
			rem = word(divisor % wRight);
		}
		wRight = rem;
		return *this;
	}